

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

bool __thiscall
axl::sl::Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::
setCountImpl<axl::sl::SimpleArrayDetails<wchar_t>::Construct>
          (Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *this,size_t count)

{
  ulong uVar1;
  size_t sVar2;
  BufHdr *pBVar3;
  Hdr *pHVar4;
  size_t size;
  bool bVar5;
  Ptr<axl::rc::BufHdr> hdr;
  Ptr<axl::rc::BufHdr> local_38;
  
  size = count * 4;
  pHVar4 = (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_hdr;
  if ((pHVar4 != (Hdr *)0x0) && ((pHVar4->super_RefCount).m_refCount == 1)) {
    if ((this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count == count) {
      return true;
    }
    if (size <= pHVar4->m_bufferSize) {
      (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count = count;
      return true;
    }
  }
  if (count == 0) {
    ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::release
              (&this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>);
  }
  else {
    if ((this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count != 0) {
      sVar2 = getAllocSize<4096ul>(size);
      pBVar3 = (BufHdr *)mem::allocate(sVar2 + 0x28);
      (pBVar3->super_RefCount).m_refCount = 0;
      (pBVar3->super_RefCount).m_weakRefCount = 1;
      (pBVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__RefCount_00198a88;
      pBVar3->m_bufferSize = sVar2;
      pBVar3->m_flags = 0;
      (pBVar3->super_RefCount).m_freeFunc = mem::deallocate;
      rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>(&local_38,pBVar3);
      bVar5 = local_38.m_p != (Hdr *)0x0;
      if (bVar5) {
        pHVar4 = local_38.m_p + 1;
        uVar1 = (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count;
        if (uVar1 < count) {
          size = uVar1 * 4;
        }
        __wrap_memcpy(pHVar4,(this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_p,
                      size);
        rc::RefCount::release
                  (&((this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_hdr)->
                    super_RefCount);
        pBVar3 = local_38.m_p;
        (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_p = (wchar_t *)pHVar4;
        local_38.m_p = (Hdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_hdr = pBVar3;
        (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count = count;
      }
      rc::Ptr<axl::rc::BufHdr>::~Ptr(&local_38);
      return bVar5;
    }
    bVar5 = reserve(this,count);
    if (!bVar5) {
      return false;
    }
    (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_count = count;
  }
  return true;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}